

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

void __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
async_connect(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this,
             string *host,string *service,function<void_(const_std::error_code_&)> *cb)

{
  pointer pbVar1;
  undefined8 *puVar2;
  pointer pbVar3;
  undefined8 uVar4;
  results_type endpoint_iterator;
  query query;
  results_type local_c0;
  data_union local_a8;
  basic_resolver_query<asio::ip::tcp> local_88;
  
  local_a8._0_4_ = 2;
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&local_88,(protocol_type *)&local_a8.base,host,service,address_configured);
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            (&local_c0,&this->resolver_,&local_88);
  pbVar3 = ((local_c0.super_basic_resolver_iterator<asio::ip::tcp>.values_.
             super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->
           super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = pbVar3 + local_c0.super_basic_resolver_iterator<asio::ip::tcp>.index_;
  local_a8._0_8_ = *(undefined8 *)&(pbVar1->endpoint_).impl_.data_;
  puVar2 = (undefined8 *)
           ((long)&pbVar3[local_c0.super_basic_resolver_iterator<asio::ip::tcp>.index_].endpoint_.
                   impl_.data_ + 0xc);
  uVar4 = *puVar2;
  local_a8._20_8_ = puVar2[1];
  local_a8._8_4_ = (undefined4)*(undefined8 *)((long)&(pbVar1->endpoint_).impl_.data_ + 8);
  local_a8._12_4_ = (undefined4)uVar4;
  local_a8._16_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  ::asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::
  async_connect<std::function<void_(const_std::error_code_&)>_&>
            (&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,
             (endpoint_type *)&local_a8.base,cb);
  if (local_c0.super_basic_resolver_iterator<asio::ip::tcp>.values_.
      super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c0.super_basic_resolver_iterator<asio::ip::tcp>.values_.
               super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.service_name_._M_dataplus._M_p != &local_88.service_name_.field_2) {
    operator_delete(local_88.service_name_._M_dataplus._M_p,
                    local_88.service_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.host_name_._M_dataplus._M_p != &local_88.host_name_.field_2) {
    operator_delete(local_88.host_name_._M_dataplus._M_p,
                    local_88.host_name_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void async_connect(
        std::string host,
        std::string service,
        std::function<void(const std::error_code&)> cb)
    {
        asio::ip::tcp::resolver::query query(
            asio::ip::tcp::v4(), host, service);
        auto endpoint_iterator = resolver_.resolve(query);

        socket_.lowest_layer().async_connect(*endpoint_iterator, cb);
    }